

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O2

char * __thiscall spdlog::details::os::getenv_abi_cxx11_(os *this,char *__name)

{
  char *pcVar1;
  allocator local_9;
  
  pcVar1 = ::getenv(__name);
  if (pcVar1 == (char *)0x0) {
    *(os **)this = this + 0x10;
    *(undefined8 *)(this + 8) = 0;
    this[0x10] = (os)0x0;
  }
  else {
    std::__cxx11::string::string((string *)this,pcVar1,&local_9);
  }
  return (char *)this;
}

Assistant:

std::string SPDLOG_INLINE getenv(const char *field)
{

#if defined(_MSC_VER)
#if defined(__cplusplus_winrt)
    return std::string{}; // not supported under uwp
#else
    size_t len = 0;
    char buf[128];
    bool ok = ::getenv_s(&len, buf, sizeof(buf), field) == 0;
    return ok ? buf : std::string{};
#endif
#else // revert to getenv
    char *buf = ::getenv(field);
    return buf ? buf : std::string{};
#endif
}